

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O3

bool double_conversion::Advance<unsigned_short_const*>
               (unsigned_short **it,uc16 separator,int base,unsigned_short **end)

{
  bool bVar1;
  ushort *puVar2;
  undefined6 in_register_00000032;
  ushort *puVar3;
  ushort *puVar4;
  
  puVar3 = *it;
  if ((int)CONCAT62(in_register_00000032,separator) == 0) {
    *it = puVar3 + 1;
    bVar1 = puVar3 + 1 == *end;
  }
  else {
    bVar1 = isDigit((uint)*puVar3,base);
    puVar2 = puVar3 + 1;
    *it = puVar2;
    puVar4 = *end;
    if ((~bVar1 & 1U) != 0 || puVar2 == puVar4) {
      bVar1 = bVar1 || puVar2 == puVar4;
    }
    else {
      puVar3 = puVar3 + 2;
      if (puVar3 == puVar4) {
        bVar1 = false;
      }
      else {
        if ((*puVar2 == separator) && (bVar1 = isDigit((uint)*puVar3,base), bVar1)) {
          *it = puVar3;
          puVar4 = *end;
          puVar2 = puVar3;
        }
        bVar1 = puVar2 == puVar4;
      }
    }
  }
  return bVar1;
}

Assistant:

static bool Advance (Iterator* it, uc16 separator, int base, Iterator& end) {
  if (separator == StringToDoubleConverter::kNoSeparator) {
    ++(*it);
    return *it == end;
  }
  if (!isDigit(**it, base)) {
    ++(*it);
    return *it == end;
  }
  ++(*it);
  if (*it == end) return true;
  if (*it + 1 == end) return false;
  if (**it == separator && isDigit(*(*it + 1), base)) {
    ++(*it);
  }
  return *it == end;
}